

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::operator==
          (GaussianPlumeRecord *this,GaussianPlumeRecord *Value)

{
  KBOOL KVar1;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (!KVar1) {
    KVar1 = WorldCoordinates::operator!=(&this->m_SrcLocation,&Value->m_SrcLocation);
    if ((((!KVar1) && (KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)) &&
        (KVar1 = Vector::operator!=(&this->m_PlumeLWH,&Value->m_PlumeLWH), !KVar1)) &&
       ((KVar1 = Vector::operator!=(&this->m_DDTLEH,&Value->m_DDTLEH), !KVar1 &&
        (KVar1 = WorldCoordinates::operator!=(&this->m_SrcLocation,&Value->m_SrcLocation), !KVar1)))
       ) {
      if (((float)this->m_f32LdEdgeCenHght == (float)Value->m_f32LdEdgeCenHght) &&
         (!NAN((float)this->m_f32LdEdgeCenHght) && !NAN((float)Value->m_f32LdEdgeCenHght))) {
        KVar1 = Vector::operator!=(&this->m_LdEdgeVel,&Value->m_LdEdgeVel);
        return !KVar1;
      }
    }
  }
  return false;
}

Assistant:

KBOOL GaussianPlumeRecord::operator == ( const GaussianPlumeRecord & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )           return false;
    if( m_SrcLocation       != Value.m_SrcLocation )        return false;
    if( m_Ori               != Value.m_Ori )                return false;
    if( m_PlumeLWH          != Value.m_PlumeLWH )           return false;
    if( m_DDTLEH            != Value.m_DDTLEH )             return false;
    if( m_SrcLocation       != Value.m_SrcLocation )        return false;
    if( m_f32LdEdgeCenHght  != Value.m_f32LdEdgeCenHght )   return false;
    if( m_LdEdgeVel         != Value.m_LdEdgeVel )          return false;
    return true;
}